

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O0

void __thiscall
singleParticleSpectra::output_four_particle_Cn4_correlation(singleParticleSpectra *this)

{
  _Setw _Var1;
  _Setprecision _Var2;
  ostream *poVar3;
  char *pcVar4;
  reference pvVar5;
  void *pvVar6;
  string *in_RDI;
  double dVar7;
  double dVar8;
  double dVar9;
  double Cn4_avg_err;
  double Cn4_stdsq;
  double Cn4_avg;
  int i;
  double num_pair_err;
  double num_pair_stdsq;
  double num_pair;
  ofstream output;
  ostringstream filename;
  double local_3f0;
  int local_3d4;
  double local_3c8;
  string local_3b0 [32];
  ostream local_390 [528];
  ostringstream local_180 [384];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  if (*(int *)(in_RDI + 0x238) == 0) {
    poVar3 = std::operator<<((ostream *)local_180,in_RDI);
    poVar3 = std::operator<<(poVar3,"/particle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
    poVar3 = std::operator<<(poVar3,"_Cn4");
    poVar3 = std::operator<<(poVar3,"_eta_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
    std::operator<<(poVar3,".dat");
  }
  else {
    poVar3 = std::operator<<((ostream *)local_180,in_RDI);
    poVar3 = std::operator<<(poVar3,"/particle_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)(in_RDI + 0x1b8));
    poVar3 = std::operator<<(poVar3,"_Cn4");
    poVar3 = std::operator<<(poVar3,"_y_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x240));
    poVar3 = std::operator<<(poVar3,"_");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(double *)(in_RDI + 0x248));
    std::operator<<(poVar3,".dat");
  }
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_390,pcVar4,_S_out);
  std::__cxx11::string::~string(local_3b0);
  poVar3 = std::operator<<(local_390,"# n  Cn4  Cn4_err");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),0);
  dVar7 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),0);
  dVar8 = -dVar7 * dVar7 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
  local_3c8 = 0.0;
  if (0.0 < dVar8) {
    local_3c8 = sqrt(dVar8 / (double)*(int *)(in_RDI + 0x2f8));
  }
  poVar3 = (ostream *)std::ostream::operator<<(local_390,std::scientific);
  _Var1 = std::setw(0x12);
  poVar3 = std::operator<<(poVar3,_Var1);
  _Var2 = std::setprecision(8);
  poVar3 = std::operator<<(poVar3,_Var2);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,0);
  poVar3 = std::operator<<(poVar3,"  ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
  poVar3 = std::operator<<(poVar3,"  ");
  pvVar6 = (void *)std::ostream::operator<<(poVar3,local_3c8);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  for (local_3d4 = 1; local_3d4 < *(int *)(in_RDI + 0x790); local_3d4 = local_3d4 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x798),(long)local_3d4)
    ;
    dVar8 = *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x7b0),(long)local_3d4)
    ;
    dVar9 = -dVar8 * dVar8 + *pvVar5 / (double)*(int *)(in_RDI + 0x2f8);
    local_3f0 = 0.0;
    if (0.0 < dVar9) {
      local_3f0 = sqrt(dVar9 / (double)*(int *)(in_RDI + 0x2f8));
      local_3f0 = local_3f0 / dVar7;
    }
    poVar3 = (ostream *)std::ostream::operator<<(local_390,std::scientific);
    _Var1 = std::setw(0x12);
    poVar3 = std::operator<<(poVar3,_Var1);
    _Var2 = std::setprecision(8);
    poVar3 = std::operator<<(poVar3,_Var2);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_3d4);
    poVar3 = std::operator<<(poVar3,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8 / dVar7);
    poVar3 = std::operator<<(poVar3,"  ");
    pvVar6 = (void *)std::ostream::operator<<(poVar3,local_3f0);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  }
  std::ofstream::~ofstream(local_390);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void singleParticleSpectra::output_four_particle_Cn4_correlation() {
    ostringstream filename;
    if (rap_type == 0) {
        filename << path_ << "/particle_" << particle_monval << "_Cn4"
                 << "_eta_" << rap_min << "_" << rap_max << ".dat";
    } else {
        filename << path_ << "/particle_" << particle_monval << "_Cn4"
                 << "_y_" << rap_min << "_" << rap_max << ".dat";
    }
    ofstream output(filename.str().c_str());
    output << "# n  Cn4  Cn4_err" << endl;
    double num_pair = Cn4[0] / total_number_of_events;
    double num_pair_stdsq =
        (Cn4_err[0] / total_number_of_events - num_pair * num_pair);
    double num_pair_err = 0.0;
    if (num_pair_stdsq > 0) {
        num_pair_err = sqrt(num_pair_stdsq / total_number_of_events);
    }
    output << scientific << setw(18) << setprecision(8) << 0 << "  " << num_pair
           << "  " << num_pair_err << endl;
    for (int i = 1; i < num_Cn4; i++) {
        double Cn4_avg = Cn4[i] / total_number_of_events;
        double Cn4_stdsq =
            (Cn4_err[i] / total_number_of_events - Cn4_avg * Cn4_avg);
        Cn4_avg = Cn4_avg / num_pair;
        double Cn4_avg_err = 0.0;
        if (Cn4_stdsq > 0) {
            Cn4_avg_err = sqrt(Cn4_stdsq / total_number_of_events);
            Cn4_avg_err = Cn4_avg_err / num_pair;
        }
        output << scientific << setw(18) << setprecision(8) << i << "  "
               << Cn4_avg << "  " << Cn4_avg_err << endl;
    }
}